

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# normalize.cpp
# Opt level: O3

string * fs_drop_slash_abi_cxx11_(string *__return_storage_ptr__,string_view in)

{
  char cVar1;
  ulong uVar2;
  size_t __n;
  size_type sVar3;
  _Bool _Var4;
  int iVar5;
  pointer pcVar6;
  pointer pcVar7;
  size_type sVar8;
  size_type sVar9;
  char cVar10;
  bool bVar11;
  undefined1 in_stack_00000008 [16];
  long *local_40;
  size_t local_38;
  long local_30 [2];
  
  fs_as_posix_abi_cxx11_(__return_storage_ptr__,in);
  uVar2 = __return_storage_ptr__->_M_string_length;
  while ((1 < uVar2 && ((__return_storage_ptr__->_M_dataplus)._M_p[uVar2 - 1] == '/'))) {
    std::__cxx11::string::pop_back();
    uVar2 = __return_storage_ptr__->_M_string_length;
  }
  _Var4 = fs_is_windows();
  if (_Var4 && in._M_len != 0) {
    fs_root_name_abi_cxx11_((string_view)in_stack_00000008);
    __n = __return_storage_ptr__->_M_string_length;
    if (__n == local_38) {
      if (__n == 0) {
        bVar11 = true;
      }
      else {
        iVar5 = bcmp((__return_storage_ptr__->_M_dataplus)._M_p,local_40,__n);
        bVar11 = iVar5 == 0;
      }
    }
    else {
      bVar11 = false;
    }
    if (local_40 != local_30) {
      operator_delete(local_40,local_30[0] + 1);
    }
    if (bVar11) {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
  }
  pcVar6 = (__return_storage_ptr__->_M_dataplus)._M_p;
  sVar3 = __return_storage_ptr__->_M_string_length;
  pcVar7 = pcVar6 + sVar3;
  if (sVar3 != 0) {
    sVar9 = 1;
    do {
      sVar8 = sVar9;
      if (sVar3 == sVar8) goto LAB_0010a13f;
      sVar9 = sVar8 + 1;
    } while ((pcVar6[sVar8 - 1] != '/') || (pcVar6[sVar8] != '/'));
    pcVar7 = pcVar6 + (sVar8 - 1);
    if (sVar3 != sVar9) {
      cVar10 = '/';
      do {
        cVar1 = pcVar6[sVar9];
        if (cVar1 != '/' || cVar10 != '/') {
          pcVar7[1] = cVar1;
          pcVar7 = pcVar7 + 1;
        }
        sVar9 = sVar9 + 1;
        cVar10 = cVar1;
      } while (sVar3 != sVar9);
      pcVar6 = (__return_storage_ptr__->_M_dataplus)._M_p;
    }
    pcVar7 = pcVar7 + 1;
  }
LAB_0010a13f:
  __return_storage_ptr__->_M_string_length = (long)pcVar7 - (long)pcVar6;
  *pcVar7 = '\0';
  return __return_storage_ptr__;
}

Assistant:

std::string
fs_drop_slash(std::string_view in)
{
  // drop all trailing "/" and duplicated internal "/"
  std::string s = fs_as_posix(in);

  while(s.length() > 1 && s.back() == '/')
    s.pop_back();

  if (fs_is_windows() && !in.empty() && s == fs_root_name(in))
    s.append("/");

  if(fs_trace > 1) std::cout << "TRACE:drop_slash(" << in << "): removed trailing slash: " << s << "\n";

  s.erase(std::unique(s.begin(), s.end(), [](char a, char b){ return a == '/' && b == '/'; }), s.end());

  if(fs_trace > 1) std::cout << "TRACE:drop_slash(" << in << "): removed duplicated internal slashes: " << s << "\n";

  return s;
}